

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getSFloat(ImageT<float,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  allocator_type *__a;
  float *pfVar1;
  uchar *puVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  float outValue_1;
  uint16_t outValue;
  uchar *target;
  float value;
  uint32_t c;
  uint32_t x;
  uint32_t y;
  uint32_t targetBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  float in_stack_ffffffffffffff74;
  float local_88;
  float local_84;
  undefined1 *__n;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar3;
  float local_50;
  uint16_t local_4a;
  float *local_48;
  float local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  undefined1 local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint local_14;
  
  if (4 < in_EDX) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar3 = in_ECX == 0x10 || in_ECX == 0x20;
  if (in_ECX == 0x10 || in_ECX == 0x20) {
    local_1c = in_ECX >> 3;
    local_1d = 0;
    __a = (allocator_type *)
          (ulong)(*(int *)(in_RSI + 0xc) * *(int *)(in_RSI + 8) * in_EDX * local_1c);
    __n = &local_1e;
    local_14 = in_EDX;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x24580a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffff90),(size_type)__n,__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x24582a);
    for (local_30 = 0; local_30 < *(uint *)(in_RSI + 0xc); local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < *(uint *)(in_RSI + 8); local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
          if (local_38 < 4) {
            pfVar1 = color<float,_4U>::operator[]
                               ((color<float,_4U> *)
                                (*(long *)(in_RSI + 0x18) +
                                (ulong)(local_30 * *(int *)(in_RSI + 8) + local_34) * 0x10),local_38
                               );
            local_84 = *pfVar1;
          }
          else {
            in_stack_ffffffffffffff74 = 1.0;
            local_88 = 0.0;
            if (local_38 == 3) {
              local_88 = 1.0;
            }
            local_84 = local_88;
          }
          local_3c = local_84;
          puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2458ff);
          local_48 = (float *)(puVar2 + (local_30 * *(int *)(in_RSI + 8) * local_14 +
                                         local_34 * local_14 + local_38) * local_1c);
          if (local_1c == 4) {
            *local_48 = local_3c;
          }
          else if (local_1c == 2) {
            local_4a = imageio::float_to_half(in_stack_ffffffffffffff74);
            memcpy(local_48,&local_4a,(ulong)local_1c);
          }
          else if (local_1c == 4) {
            local_50 = local_3c;
            memcpy(local_48,&local_50,4);
          }
        }
      }
    }
    return in_RDI;
  }
  __assert_fail("targetBits == 16 || targetBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x38f,
                "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }